

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O0

void __thiscall
transwarp::value_task<bool>::value_task<bool_const&>
          (value_task<bool> *this,bool has_name,string *name,bool *value)

{
  node *this_00;
  element_type *peVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__p;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48 [2];
  bool *local_28;
  bool *value_local;
  string *name_local;
  value_task<bool> *pvStack_10;
  bool has_name_local;
  value_task<bool> *this_local;
  
  local_28 = value;
  value_local = (bool *)name;
  name_local._7_1_ = has_name;
  pvStack_10 = this;
  task<bool>::task(&this->super_task<bool>);
  std::enable_shared_from_this<transwarp::value_task<bool>_>::enable_shared_from_this
            (&this->super_enable_shared_from_this<transwarp::value_task<bool>_>);
  (this->super_task<bool>).super_itask._vptr_itask = (_func_int **)&PTR__value_task_0036cf88;
  this_00 = (node *)operator_new(0x80);
  node::node(this_00);
  std::shared_ptr<transwarp::node>::shared_ptr<transwarp::node,void>(&this->node_,this_00);
  detail::make_future_with_value<bool,bool_const&>((detail *)&this->future_,local_28);
  this->visited_ = false;
  peVar1 = std::__shared_ptr_access<transwarp::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<transwarp::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&this->node_);
  detail::node_manip::set_type(peVar1,root);
  peVar1 = std::__shared_ptr_access<transwarp::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<transwarp::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&this->node_);
  if ((name_local._7_1_ & 1) == 0) {
    std::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    shared_ptr(local_48,(nullptr_t)0x0);
  }
  else {
    __p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
    std::__cxx11::string::string((string *)__p,(string *)name);
    std::shared_ptr<std::__cxx11::string>::shared_ptr<std::__cxx11::string,void>
              ((shared_ptr<std::__cxx11::string> *)local_48,__p);
  }
  detail::node_manip::set_name(peVar1,local_48);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr(local_48);
  return;
}

Assistant:

value_task(bool has_name, std::string name, T&& value)
    : node_(new transwarp::node),
      future_(transwarp::detail::make_future_with_value<result_type>(std::forward<T>(value)))
    {
        transwarp::detail::node_manip::set_type(*node_, task_type::value);
        transwarp::detail::node_manip::set_name(*node_, (has_name ? std::shared_ptr<std::string>(new std::string(std::move(name))) : nullptr));
    }